

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O0

void __thiscall
leveldb::TableCache::TableCache(TableCache *this,string *dbname,Options *options,int entries)

{
  Cache *pCVar1;
  int entries_local;
  Options *options_local;
  string *dbname_local;
  TableCache *this_local;
  
  this->env_ = options->env;
  std::__cxx11::string::string((string *)&this->dbname_,(string *)dbname);
  this->options_ = options;
  pCVar1 = NewLRUCache((long)entries);
  this->cache_ = pCVar1;
  return;
}

Assistant:

TableCache::TableCache(const std::string& dbname, const Options& options,
                       int entries)
    : env_(options.env),
      dbname_(dbname),
      options_(options),
      cache_(NewLRUCache(entries)) {}